

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O3

Constant * LLVMBC::dyn_cast<LLVMBC::Constant>(Value *value)

{
  bool bVar1;
  ValueKind VVar2;
  Constant *pCVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  char acStack_1018 [4104];
  
  if (value == (Value *)0x0) {
    pCVar3 = (Constant *)0x0;
  }
  else {
    while (VVar2 = Value::get_value_kind(value), VVar2 == Proxy) {
      VVar2 = Value::get_value_kind(value);
      if (VVar2 != Proxy) {
        p_Var4 = ::dxil_spv::get_thread_log_callback();
        if (p_Var4 != (LoggingCallback)0x0) {
          builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
          builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
          pvVar5 = ::dxil_spv::get_thread_log_callback_userdata();
          (*p_Var4)(pvVar5,Error,acStack_1018);
          std::terminate();
        }
        dyn_cast<LLVMBC::Constant>();
        std::terminate();
      }
      value = (Value *)(((Constant *)value)->apfloat).type;
    }
    VVar2 = Value::get_value_kind(value);
    bVar1 = Constant::is_base_of_value_kind(VVar2);
    pCVar3 = (Constant *)0x0;
    if (bVar1) {
      pCVar3 = (Constant *)value;
    }
  }
  return pCVar3;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}